

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwkMerge.c
# Opt level: O3

void Nwk_ManGraphPrepare(Nwk_Grf_t *p)

{
  size_t __size;
  int iVar1;
  int iVar2;
  uint uVar3;
  Nwk_Edg_t **ppNVar4;
  Nwk_Vrt_t *pNVar5;
  bool bVar6;
  int *__s;
  int *piVar7;
  void *__ptr;
  Aig_MmFlex_t *pAVar8;
  Nwk_Vrt_t **ppNVar9;
  Nwk_Vrt_t *pNVar10;
  ulong uVar11;
  long lVar12;
  Nwk_Edg_t *pNVar13;
  int iVar14;
  size_t __size_00;
  long lVar15;
  int iVar16;
  
  iVar14 = p->nObjs;
  __size_00 = (long)(int)(iVar14 + 1U) << 2;
  __s = (int *)malloc(__size_00);
  p->pMapLut2Id = __s;
  __size = (long)p->nVertsMax * 4 + 4;
  piVar7 = (int *)malloc(__size);
  p->pMapId2Lut = piVar7;
  memset(__s,0xff,__size_00);
  memset(piVar7,0xff,__size);
  iVar1 = p->nEdgeHash;
  lVar15 = (long)iVar1;
  if (0 < lVar15) {
    ppNVar4 = p->pEdgeHash;
    lVar12 = 0;
    do {
      for (pNVar13 = ppNVar4[lVar12]; pNVar13 != (Nwk_Edg_t *)0x0; pNVar13 = pNVar13->pNext) {
        if (iVar14 < pNVar13->iNode1) {
          __assert_fail("pEntry->iNode1 <= p->nObjs",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/nwk/nwkMerge.c"
                        ,0x121,"void Nwk_ManGraphPrepare(Nwk_Grf_t *)");
        }
        if (iVar14 < pNVar13->iNode2) {
          __assert_fail("pEntry->iNode2 <= p->nObjs",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/nwk/nwkMerge.c"
                        ,0x122,"void Nwk_ManGraphPrepare(Nwk_Grf_t *)");
        }
        __s[pNVar13->iNode1] = 0;
        __s[pNVar13->iNode2] = 0;
      }
      lVar12 = lVar12 + 1;
    } while (lVar12 != lVar15);
  }
  p->nVerts = 0;
  if (iVar14 < 0) {
    iVar16 = 0;
  }
  else {
    iVar16 = 0;
    uVar11 = 0;
    do {
      if (__s[uVar11] == 0) {
        lVar12 = (long)iVar16;
        iVar16 = iVar16 + 1;
        p->nVerts = iVar16;
        __s[uVar11] = iVar16;
        piVar7[lVar12 + 1] = (int)uVar11;
      }
      uVar11 = uVar11 + 1;
    } while (iVar14 + 1U != uVar11);
  }
  __ptr = calloc((long)(iVar16 + 1),4);
  if (0 < iVar1) {
    ppNVar4 = p->pEdgeHash;
    lVar12 = 0;
    do {
      for (pNVar13 = ppNVar4[lVar12]; pNVar13 != (Nwk_Edg_t *)0x0; pNVar13 = pNVar13->pNext) {
        if (iVar14 < pNVar13->iNode1) {
          __assert_fail("pEntry->iNode1 <= p->nObjs",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/nwk/nwkMerge.c"
                        ,0x135,"void Nwk_ManGraphPrepare(Nwk_Grf_t *)");
        }
        if (iVar14 < pNVar13->iNode2) {
          __assert_fail("pEntry->iNode2 <= p->nObjs",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/nwk/nwkMerge.c"
                        ,0x136,"void Nwk_ManGraphPrepare(Nwk_Grf_t *)");
        }
        iVar1 = __s[pNVar13->iNode1];
        pNVar13->iNode1 = iVar1;
        iVar2 = __s[pNVar13->iNode2];
        pNVar13->iNode2 = iVar2;
        if (iVar16 < iVar1) {
          __assert_fail("pEntry->iNode1 <= p->nVerts",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/nwk/nwkMerge.c"
                        ,0x13a,"void Nwk_ManGraphPrepare(Nwk_Grf_t *)");
        }
        if (iVar16 < iVar2) {
          __assert_fail("pEntry->iNode2 <= p->nVerts",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/nwk/nwkMerge.c"
                        ,0x13b,"void Nwk_ManGraphPrepare(Nwk_Grf_t *)");
        }
        piVar7 = (int *)((long)__ptr + (long)iVar1 * 4);
        *piVar7 = *piVar7 + 1;
        piVar7 = (int *)((long)__ptr + (long)iVar2 * 4);
        *piVar7 = *piVar7 + 1;
      }
      lVar12 = lVar12 + 1;
    } while (lVar12 != lVar15);
  }
  pAVar8 = Aig_MmFlexStart();
  p->pMemVerts = pAVar8;
  uVar11 = (ulong)p->nVerts;
  ppNVar9 = (Nwk_Vrt_t **)malloc(uVar11 * 8 + 8);
  p->pVerts = ppNVar9;
  *ppNVar9 = (Nwk_Vrt_t *)0x0;
  if (0 < (long)uVar11) {
    lVar15 = 1;
    do {
      iVar14 = *(int *)((long)__ptr + lVar15 * 4);
      if (iVar14 < 1) {
        __assert_fail("pnEdges[i] > 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/nwk/nwkMerge.c"
                      ,0x145,"void Nwk_ManGraphPrepare(Nwk_Grf_t *)");
      }
      iVar14 = iVar14 * 4 + 0x10;
      pNVar10 = (Nwk_Vrt_t *)Aig_MmFlexEntryFetch(p->pMemVerts,iVar14);
      p->pVerts[lVar15] = pNVar10;
      memset(p->pVerts[lVar15],0,(long)iVar14);
      ppNVar9 = p->pVerts;
      ppNVar9[lVar15]->Id = (int)lVar15;
      uVar11 = (ulong)p->nVerts;
      bVar6 = lVar15 < (long)uVar11;
      lVar15 = lVar15 + 1;
    } while (bVar6);
  }
  iVar14 = p->nEdgeHash;
  if (0 < iVar14) {
    ppNVar4 = p->pEdgeHash;
    lVar15 = 0;
    do {
      pNVar13 = ppNVar4[lVar15];
      if (pNVar13 != (Nwk_Edg_t *)0x0) {
        do {
          pNVar10 = ppNVar9[pNVar13->iNode1];
          iVar14 = pNVar13->iNode2;
          iVar1 = pNVar10->nEdges;
          pNVar10->nEdges = iVar1 + 1;
          (&pNVar10[1].Id)[iVar1] = iVar14;
          pNVar10 = ppNVar9[iVar14];
          iVar14 = pNVar13->iNode1;
          iVar1 = pNVar10->nEdges;
          pNVar10->nEdges = iVar1 + 1;
          (&pNVar10[1].Id)[iVar1] = iVar14;
          pNVar13 = pNVar13->pNext;
        } while (pNVar13 != (Nwk_Edg_t *)0x0);
        iVar14 = p->nEdgeHash;
      }
      lVar15 = lVar15 + 1;
    } while (lVar15 < iVar14);
    uVar11 = (ulong)(uint)p->nVerts;
  }
  if (0 < (int)uVar11) {
    lVar15 = 0;
    do {
      pNVar10 = ppNVar9[lVar15 + 1];
      uVar3 = pNVar10->nEdges;
      if (uVar3 != *(uint *)((long)__ptr + lVar15 * 4 + 4)) {
        __assert_fail("p->pVerts[i]->nEdges == pnEdges[i]",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/nwk/nwkMerge.c"
                      ,0x156,"void Nwk_ManGraphPrepare(Nwk_Grf_t *)");
      }
      if ((int)uVar3 < 1) {
        __assert_fail("pVertex->nEdges > 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/nwk/nwkMerge.c"
                      ,0xd5,"void Nwk_ManGraphListInsert(Nwk_Grf_t *, Nwk_Vrt_t *)");
      }
      if (uVar3 == 1) {
        lVar12 = (long)ppNVar9[pNVar10[1].Id]->nEdges;
        if (lVar12 < 0x10) {
          iVar14 = pNVar10->Id;
          if ((long)p->pLists1[lVar12] != 0) {
            pNVar5 = ppNVar9[p->pLists1[lVar12]];
            pNVar10->iPrev = 0;
            pNVar10->iNext = pNVar5->Id;
            pNVar5->iPrev = iVar14;
          }
          p->pLists1[lVar12] = iVar14;
          uVar11 = (ulong)(uint)p->nVerts;
        }
        else {
          iVar14 = pNVar10->Id;
          if ((long)p->pLists1[0x10] != 0) {
            pNVar5 = ppNVar9[p->pLists1[0x10]];
            pNVar10->iPrev = 0;
            pNVar10->iNext = pNVar5->Id;
            pNVar5->iPrev = iVar14;
          }
          p->pLists1[0x10] = iVar14;
        }
      }
      else if (uVar3 < 0x10) {
        iVar14 = pNVar10->Id;
        if ((long)p->pLists2[uVar3] != 0) {
          pNVar5 = ppNVar9[p->pLists2[uVar3]];
          pNVar10->iPrev = 0;
          pNVar10->iNext = pNVar5->Id;
          pNVar5->iPrev = iVar14;
        }
        p->pLists2[uVar3] = iVar14;
      }
      else {
        iVar14 = pNVar10->Id;
        if ((long)p->pLists2[0x10] != 0) {
          pNVar5 = ppNVar9[p->pLists2[0x10]];
          pNVar10->iPrev = 0;
          pNVar10->iNext = pNVar5->Id;
          pNVar5->iPrev = iVar14;
        }
        p->pLists2[0x10] = iVar14;
      }
      lVar15 = lVar15 + 1;
    } while (lVar15 < (int)uVar11);
  }
  Aig_MmFixedStop(p->pMemEdges,0);
  p->pMemEdges = (Aig_MmFixed_t *)0x0;
  if (p->pEdgeHash != (Nwk_Edg_t **)0x0) {
    free(p->pEdgeHash);
    p->pEdgeHash = (Nwk_Edg_t **)0x0;
  }
  if (__ptr == (void *)0x0) {
    return;
  }
  free(__ptr);
  return;
}

Assistant:

void Nwk_ManGraphPrepare( Nwk_Grf_t * p )
{
    Nwk_Edg_t * pEntry;
    Nwk_Vrt_t * pVertex;
    int * pnEdges, nBytes, i;
    // allocate memory for the present objects
    p->pMapLut2Id = ABC_ALLOC( int, p->nObjs+1 );
    p->pMapId2Lut = ABC_ALLOC( int, p->nVertsMax+1 );
    memset( p->pMapLut2Id, 0xff, sizeof(int) * (p->nObjs+1) );
    memset( p->pMapId2Lut, 0xff, sizeof(int) * (p->nVertsMax+1) );
    // mark present objects
    Nwk_GraphForEachEdge( p, pEntry, i )
    {
        assert( pEntry->iNode1 <= p->nObjs );
        assert( pEntry->iNode2 <= p->nObjs );
        p->pMapLut2Id[ pEntry->iNode1 ] = 0;
        p->pMapLut2Id[ pEntry->iNode2 ] = 0;
    }
    // map objects
    p->nVerts = 0;
    for ( i = 0; i <= p->nObjs; i++ )
    {
        if ( p->pMapLut2Id[i] == 0 )
        {
            p->pMapLut2Id[i] = ++p->nVerts;
            p->pMapId2Lut[p->nVerts] = i;
        }
    }
    // count the edges and mark present objects
    pnEdges = ABC_CALLOC( int, p->nVerts+1 );
    Nwk_GraphForEachEdge( p, pEntry, i )
    {
        // translate into vertices
        assert( pEntry->iNode1 <= p->nObjs );
        assert( pEntry->iNode2 <= p->nObjs );
        pEntry->iNode1 = p->pMapLut2Id[pEntry->iNode1];
        pEntry->iNode2 = p->pMapLut2Id[pEntry->iNode2];
        // count the edges
        assert( pEntry->iNode1 <= p->nVerts );
        assert( pEntry->iNode2 <= p->nVerts );
        pnEdges[pEntry->iNode1]++;
        pnEdges[pEntry->iNode2]++;
    }
    // allocate the real graph
    p->pMemVerts  = Aig_MmFlexStart();
    p->pVerts = ABC_ALLOC( Nwk_Vrt_t *, p->nVerts + 1 );
    p->pVerts[0] = NULL;
    for ( i = 1; i <= p->nVerts; i++ )
    {
        assert( pnEdges[i] > 0 );
        nBytes = sizeof(Nwk_Vrt_t) + sizeof(int) * pnEdges[i];
        p->pVerts[i] = (Nwk_Vrt_t *)Aig_MmFlexEntryFetch( p->pMemVerts, nBytes );
        memset( p->pVerts[i], 0, nBytes );
        p->pVerts[i]->Id = i;
    }
    // add edges to the real graph
    Nwk_GraphForEachEdge( p, pEntry, i )
    {
        pVertex = p->pVerts[pEntry->iNode1];
        pVertex->pEdges[ pVertex->nEdges++ ] = pEntry->iNode2;
        pVertex = p->pVerts[pEntry->iNode2];
        pVertex->pEdges[ pVertex->nEdges++ ] = pEntry->iNode1;
    }
    // put vertices into the data structure
    for ( i = 1; i <= p->nVerts; i++ )
    {
        assert( p->pVerts[i]->nEdges == pnEdges[i] );
        Nwk_ManGraphListInsert( p, p->pVerts[i] );
    }
    // clean up
    Aig_MmFixedStop( p->pMemEdges, 0 ); p->pMemEdges = NULL;
    ABC_FREE( p->pEdgeHash );
//    p->nEdgeHash = 0;
    ABC_FREE( pnEdges );
}